

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O0

Type * __thiscall
google::protobuf::internal::RepeatedPtrFieldBase::
Add<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
          (RepeatedPtrFieldBase *this)

{
  int iVar1;
  Type *result;
  RepeatedPtrFieldBase *this_local;
  
  if (this->current_size_ < this->allocated_size_) {
    iVar1 = this->current_size_;
    this->current_size_ = iVar1 + 1;
    this_local = (RepeatedPtrFieldBase *)
                 cast<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                           (this->elements_[iVar1]);
  }
  else {
    if (this->allocated_size_ == this->total_size_) {
      Reserve(this,this->total_size_ + 1);
    }
    this->allocated_size_ = this->allocated_size_ + 1;
    this_local = (RepeatedPtrFieldBase *)StringTypeHandlerBase::New_abi_cxx11_();
    iVar1 = this->current_size_;
    this->current_size_ = iVar1 + 1;
    this->elements_[iVar1] = this_local;
  }
  return (Type *)this_local;
}

Assistant:

inline typename TypeHandler::Type* RepeatedPtrFieldBase::Add() {
  if (current_size_ < allocated_size_) {
    return cast<TypeHandler>(elements_[current_size_++]);
  }
  if (allocated_size_ == total_size_) Reserve(total_size_ + 1);
  ++allocated_size_;
  typename TypeHandler::Type* result = TypeHandler::New();
  elements_[current_size_++] = result;
  return result;
}